

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O3

Object * load_library(Object *__return_storage_ptr__,int c,Environment *env,char *s)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar3;
  undefined8 uVar4;
  Object *pOVar5;
  long lVar6;
  
  if (env != (Environment *)0x0) {
    s = get_string("x",c,env);
  }
  iVar2 = hasLib(s);
  pOVar5 = (Object *)CONCAT44(extraout_var,iVar2);
  if (iVar2 == 0) {
    pvVar3 = (void *)dlopen(s,1);
    if (pvVar3 == (void *)0x0) {
      uVar4 = dlerror();
      printf("\x1b[31m\n[Runtime Error] [Line:%d] %s\x1b[0m",c,uVar4);
      stop();
    }
    lVar6 = (long)libCount;
    libCount = libCount + 1;
    lVar1 = lVar6 * 0x10;
    pOVar5 = (Object *)realloc(libraries,lVar1 + 0x10);
    libraries = (Library *)pOVar5;
    *(char **)((long)&pOVar5->type + lVar6 * 2 * 8) = s;
    *(void **)((long)&pOVar5->field_1 + lVar1) = pvVar3;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
  (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
  __return_storage_ptr__->type = OBJECT_NULL;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
  return pOVar5;
}

Assistant:

static Object load_library(int c, Environment *env, char *s){
    if(env != NULL)
        s = get_string("x", c, env);

    if(hasLib(s))
        return nullObject;

    void *lib = dlopen(s, RTLD_LAZY);
    if(!lib){
        printf(runtime_error("%s"), c, dlerror());
        stop();
    }
    libCount++;
    libraries = (Library *)reallocate(libraries, sizeof(Library) * libCount);
    libraries[libCount - 1].name = s;
    libraries[libCount - 1].handle = lib;

    return nullObject;
}